

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::RowGroup::RowGroup(RowGroup *this,RowGroup *other152)

{
  int64_t iVar1;
  
  *(undefined ***)this = &PTR__RowGroup_027ced90;
  (this->columns).
  super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
  super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).
  super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
  super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).
  super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
  super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sorting_columns).
  super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>.
  super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorting_columns).
  super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>.
  super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorting_columns).
  super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>.
  super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->__isset = (_RowGroup__isset)((byte)this->__isset & 0xf0);
  std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::operator=
            (&(this->columns).
              super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
             ,&(other152->columns).
               super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
            );
  iVar1 = other152->num_rows;
  this->total_byte_size = other152->total_byte_size;
  this->num_rows = iVar1;
  std::vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>::
  operator=(&(this->sorting_columns).
             super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
            ,&(other152->sorting_columns).
              super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
           );
  iVar1 = other152->total_compressed_size;
  this->file_offset = other152->file_offset;
  this->total_compressed_size = iVar1;
  this->ordinal = other152->ordinal;
  this->__isset = other152->__isset;
  return;
}

Assistant:

RowGroup::RowGroup(const RowGroup& other152) {
  columns = other152.columns;
  total_byte_size = other152.total_byte_size;
  num_rows = other152.num_rows;
  sorting_columns = other152.sorting_columns;
  file_offset = other152.file_offset;
  total_compressed_size = other152.total_compressed_size;
  ordinal = other152.ordinal;
  __isset = other152.__isset;
}